

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ManEvalWindowInc
              (Gia_Man_t *p,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,Vec_Wec_t *vWin,Vec_Int_t *vTemp,
              int fUseTwo)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (vNodes->nSize != vWin->nSize) {
    __assert_fail("Vec_IntSize(vNodes) == Vec_WecSize(vWin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x26b,
                  "int Gia_ManEvalWindowInc(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, int)"
                 );
  }
  Gia_ManUpdateMapping(p,vNodes,vWin);
  Gia_ManCollectTfo(p,vLeaves,vTemp);
  iVar3 = vTemp->nSize;
  if (1 < iVar3) {
    piVar2 = vTemp->pArray;
    iVar4 = -1;
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      piVar2[lVar5] = piVar2[iVar3 + iVar4];
      piVar2[vTemp->nSize + iVar4] = iVar1;
      lVar5 = lVar5 + 1;
      iVar3 = vTemp->nSize;
      iVar4 = iVar4 + -1;
    } while (lVar5 < iVar3 / 2);
  }
  if (iVar3 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar1 = vTemp->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->vMapping->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vMapping->pArray[iVar1] != 0) {
        iVar3 = Gia_ObjComputeEdgeDelay(p,iVar1,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
        if (iVar4 <= iVar3) {
          iVar4 = iVar3;
        }
        iVar3 = vTemp->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  Gia_ManUpdateMapping(p,vNodes,vWin);
  return iVar4;
}

Assistant:

int Gia_ManEvalWindowInc( Gia_Man_t * p, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Wec_t * vWin, Vec_Int_t * vTemp, int fUseTwo )
{
    int i, iLut, Delay, DelayMax = 0;
    assert( Vec_IntSize(vNodes) == Vec_WecSize(vWin) );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    Gia_ManCollectTfo( p, vLeaves, vTemp );
    Vec_IntReverseOrder( vTemp );
    Vec_IntForEachEntry( vTemp, iLut, i )
    {
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        Delay = Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Gia_ManUpdateMapping( p, vNodes, vWin );
    return DelayMax;
}